

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeNext_NOT(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  int iVar1;
  
  iVar1 = (*pNode->apChild[0]->xNext)(pExpr,pNode->apChild[0],bFromValid,iFrom);
  if ((iVar1 == 0) && (iVar1 = fts5ExprNodeTest_NOT(pExpr,pNode), iVar1 == 0)) {
    return 0;
  }
  pNode->bNomatch = 0;
  return iVar1;
}

Assistant:

static int fts5ExprNodeNext_NOT(
  Fts5Expr *pExpr,
  Fts5ExprNode *pNode,
  int bFromValid,
  i64 iFrom
){
  int rc = fts5ExprNodeNext(pExpr, pNode->apChild[0], bFromValid, iFrom);
  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest_NOT(pExpr, pNode);
  }
  if( rc!=SQLITE_OK ){
    pNode->bNomatch = 0;
  }
  return rc;
}